

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O2

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  BIT_CStream_t blockStream;
  FSE_CState_t stateLitLength;
  FSE_CState_t stateOffsetBits;
  FSE_CState_t stateMatchLength;
  
  blockStream.bitContainer = 0;
  blockStream.bitPos = 0;
  blockStream.endPtr = (char *)((long)dst + (dstCapacity - 8));
  pcVar6 = (char *)0xffffffffffffffba;
  if (8 < dstCapacity) {
    blockStream.startPtr = (char *)dst;
    blockStream.ptr = (char *)dst;
    FSE_initCState2(&stateMatchLength,CTable_MatchLength,(uint)mlCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateOffsetBits,CTable_OffsetBits,(uint)ofCodeTable[nbSeq - 1]);
    FSE_initCState2(&stateLitLength,CTable_LitLength,(uint)llCodeTable[nbSeq - 1]);
    BIT_addBits(&blockStream,(ulong)sequences[nbSeq - 1].litLength,(uint)""[llCodeTable[nbSeq - 1]])
    ;
    BIT_addBits(&blockStream,(ulong)sequences[nbSeq - 1].mlBase,(uint)""[mlCodeTable[nbSeq - 1]]);
    if (longOffsets == 0) {
      uVar8 = sequences[nbSeq - 1].offBase;
      uVar7 = (uint)ofCodeTable[nbSeq - 1];
    }
    else {
      uVar7 = (uint)ofCodeTable[nbSeq - 1];
      uVar8 = 0;
      uVar9 = (uint)ofCodeTable[nbSeq - 1];
      if ((0x37 < uVar9) && (uVar7 = 0x38, uVar9 != 0x38)) {
        uVar8 = uVar9 - 0x38;
        BIT_addBits(&blockStream,(ulong)sequences[nbSeq - 1].offBase,uVar8);
        BIT_flushBits(&blockStream);
      }
      uVar8 = sequences[nbSeq - 1].offBase >> ((byte)uVar8 & 0x1f);
    }
    BIT_addBits(&blockStream,(ulong)uVar8,uVar7);
    BIT_flushBits(&blockStream);
    for (uVar10 = nbSeq - 2; uVar10 < nbSeq; uVar10 = uVar10 - 1) {
      bVar1 = llCodeTable[uVar10];
      bVar2 = ofCodeTable[uVar10];
      uVar8 = (uint)bVar2;
      bVar3 = mlCodeTable[uVar10];
      bVar4 = ""[bVar1];
      bVar5 = ""[bVar3];
      FSE_encodeSymbol(&blockStream,&stateOffsetBits,(uint)bVar2);
      FSE_encodeSymbol(&blockStream,&stateMatchLength,(uint)bVar3);
      FSE_encodeSymbol(&blockStream,&stateLitLength,(uint)bVar1);
      uVar7 = (uint)bVar2 + (uint)bVar4 + (uint)bVar5;
      if (0x1e < uVar7) {
        BIT_flushBits(&blockStream);
      }
      BIT_addBits(&blockStream,(ulong)sequences[uVar10].litLength,(uint)bVar4);
      BIT_addBits(&blockStream,(ulong)sequences[uVar10].mlBase,(uint)bVar5);
      if (0x38 < uVar7) {
        BIT_flushBits(&blockStream);
      }
      if (longOffsets == 0) {
        uVar7 = sequences[uVar10].offBase;
      }
      else {
        uVar7 = 0;
        uVar8 = (uint)bVar2;
        if ((0x37 < bVar2) && (uVar8 = 0x38, bVar2 != 0x38)) {
          uVar7 = bVar2 - 0x38;
          BIT_addBits(&blockStream,(ulong)sequences[uVar10].offBase,uVar7);
          BIT_flushBits(&blockStream);
          uVar8 = 0x38;
        }
        uVar7 = sequences[uVar10].offBase >> ((byte)uVar7 & 0x1f);
      }
      BIT_addBits(&blockStream,(ulong)uVar7,uVar8);
      BIT_flushBits(&blockStream);
    }
    FSE_flushCState(&blockStream,&stateMatchLength);
    FSE_flushCState(&blockStream,&stateOffsetBits);
    FSE_flushCState(&blockStream,&stateLitLength);
    if (0x3f < blockStream.bitPos + 1) {
      __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                    ,0xc5,"void BIT_addBitsFast(BIT_CStream_t *, size_t, unsigned int)");
    }
    blockStream.bitContainer = blockStream.bitContainer | 1L << ((byte)blockStream.bitPos & 0x3f);
    blockStream.bitPos = blockStream.bitPos + 1;
    BIT_flushBits(&blockStream);
    if ((blockStream.endPtr <= blockStream.ptr) ||
       (pcVar6 = blockStream.ptr +
                 ((1 - (long)blockStream.startPtr) - (ulong)(blockStream.bitPos == 0)),
       pcVar6 == (char *)0x0)) {
      pcVar6 = (char *)0xffffffffffffffba;
    }
  }
  return (size_t)pcVar6;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}